

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer(chck_buffer *buf,size_t size,chck_endianess endianess)

{
  _Bool _Var1;
  bool bVar2;
  void *local_30;
  void *data;
  chck_endianess endianess_local;
  size_t size_local;
  chck_buffer *buf_local;
  
  if (buf == (chck_buffer *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                  ,0x6b,"_Bool chck_buffer(struct chck_buffer *, size_t, enum chck_endianess)");
  }
  local_30 = (void *)0x0;
  if ((size != 0) && (local_30 = malloc(size), local_30 == (void *)0x0)) {
    return false;
  }
  _Var1 = chck_buffer_from_pointer(buf,local_30,size,endianess);
  bVar2 = ((_Var1 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    buf->copied = true;
  }
  else {
    free(local_30);
  }
  return bVar2;
}

Assistant:

bool
chck_buffer(struct chck_buffer *buf, size_t size, enum chck_endianess endianess)
{
   assert(buf);

   void *data = NULL;
   if (size > 0 && !(data = malloc(size)))
      return false;

   if (unlikely(!chck_buffer_from_pointer(buf, data, size, endianess)))
      goto fail;

   buf->copied = true;
   return true;

fail:
   free(data);
   return false;
}